

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_distance.cpp
# Opt level: O1

size_type pstore::command_line::string_distance(string *from,string *to,size_type max_edit_distance)

{
  ulong n;
  ulong uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  unsigned_long *puVar5;
  ulong *puVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  size_t n_00;
  small_vector<unsigned_long,_64UL> *psVar10;
  bool bVar11;
  small_vector<unsigned_long,_64UL> column;
  ulong local_270 [3];
  small_vector<unsigned_long,_64UL> local_258;
  
  n = from->_M_string_length;
  uVar1 = to->_M_string_length;
  small_vector<unsigned_long,_64UL>::small_vector(&local_258,n + 1);
  if (local_258.elements_ != 0) {
    lVar4 = local_258.elements_ << 3;
    uVar7 = 0;
    do {
      local_258.buffer_[uVar7] = uVar7;
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  bVar11 = uVar1 == 0;
  psVar10 = &local_258;
  if (!bVar11) {
    uVar7 = 1;
    do {
      puVar5 = small_vector<unsigned_long,64ul>::
               index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,0);
      *puVar5 = uVar7;
      uVar9 = uVar7;
      if (n != 0) {
        n_00 = 1;
        uVar8 = uVar7 - 1;
        do {
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          uVar2 = *puVar5;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          local_270[0] = *puVar5 + 1;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>
                             (&local_258,n_00 - 1);
          local_270[1] = *puVar5 + 1;
          local_270[2] = ((from->_M_dataplus)._M_p[n_00 - 1] != (to->_M_dataplus)._M_p[uVar7 - 1]) +
                         uVar8;
          lVar4 = 8;
          puVar6 = local_270;
          do {
            if (*(ulong *)((long)local_270 + lVar4) < *puVar6) {
              puVar6 = (ulong *)((long)local_270 + lVar4);
            }
            lVar4 = lVar4 + 8;
          } while (lVar4 != 0x18);
          uVar3 = *puVar6;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          *puVar5 = uVar3;
          puVar5 = small_vector<unsigned_long,64ul>::
                   index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n_00);
          if (*puVar5 < uVar9) {
            uVar9 = *puVar5;
          }
          n_00 = n_00 + 1;
          uVar8 = uVar2;
        } while (n_00 <= n);
      }
      psVar10 = (small_vector<unsigned_long,_64UL> *)(max_edit_distance + 1);
      if (max_edit_distance < uVar9 && max_edit_distance != 0) break;
      uVar7 = uVar7 + 1;
      bVar11 = uVar1 < uVar7;
      psVar10 = &local_258;
    } while (uVar7 <= uVar1);
  }
  if (bVar11) {
    puVar5 = small_vector<unsigned_long,64ul>::
             index<pstore::small_vector<unsigned_long,64ul>&,unsigned_long>(&local_258,n);
    psVar10 = (small_vector<unsigned_long,_64UL> *)*puVar5;
  }
  if (local_258.big_buffer_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.big_buffer_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_258.big_buffer_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.big_buffer_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (size_type)psVar10;
}

Assistant:

std::string::size_type string_distance (std::string const & from, std::string const & to,
                                                std::string::size_type const max_edit_distance) {
            using size_type = std::string::size_type;

            size_type const m = from.size ();
            size_type const n = to.size ();

            small_vector<size_type, 64> column (m + 1U);
            std::iota (std::begin (column), std::end (column), size_type{0});
            constexpr auto column_start = size_type{1};

            for (auto x = column_start; x <= n; x++) {
                column[0] = x;
                auto best_this_column = x;
                auto last_diagonal = x - column_start;
                for (auto y = column_start; y <= m; y++) {
                    auto const old_diagonal = column[y];
                    column[y] = std::min ({column[y] + 1U, column[y - 1U] + 1U,
                                           last_diagonal + (from[y - 1U] == to[x - 1U] ? 0U : 1U)});
                    last_diagonal = old_diagonal;
                    best_this_column = std::min (best_this_column, column[y]);
                }
                if (max_edit_distance != 0 && best_this_column > max_edit_distance) {
                    return max_edit_distance + 1U;
                }
            }
            return column[m];
        }